

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitMemoryGrow
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,MemoryGrow *curr)

{
  Type type;
  Name memory;
  Name memory_00;
  char cVar1;
  Address x;
  long lVar2;
  ulong uVar3;
  Literal *this_00;
  Address size;
  Name NVar4;
  undefined1 local_168 [8];
  Flow ret;
  Literal local_108;
  Literal local_f0;
  Literal local_d8;
  Literal local_c0;
  undefined1 local_a8 [8];
  Flow flow;
  Literal fail;
  MemoryInstanceInfo info;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_a8,&this->super_ExpressionRunner<wasm::ModuleRunner>,
             *(Expression **)(curr + 0x10));
  if (flow.breakTo.super_IString.str._M_len != 0) {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_a8;
    wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,(Literal *)&flow);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)flow.breakTo.super_IString.str._M_len;
    goto LAB_0012f216;
  }
  getMemoryInstanceInfo((MemoryInstanceInfo *)&fail.type,this,(Name)*(string_view *)(curr + 0x20));
  memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
  memory.super_IString.str._M_len = (size_t)info.instance;
  x = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)fail.type.id,memory);
  NVar4.super_IString.str._M_str = (char *)info.instance;
  NVar4.super_IString.str._M_len = *(size_t *)(fail.type.id + 0x20);
  lVar2 = wasm::Module::getMemory(NVar4);
  type.id = *(uintptr_t *)(lVar2 + 0x50);
  Literal::makeFromInt64((Literal *)&flow.breakTo.super_IString.str._M_str,-1,type);
  Literal::makeFromInt64((Literal *)&ret.breakTo.super_IString.str._M_str,x.addr,type);
  Flow::Flow((Flow *)local_168,(Literal *)&ret.breakTo.super_IString.str._M_str);
  wasm::Literal::~Literal((Literal *)&ret.breakTo.super_IString.str._M_str);
  if (((long)((long)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                    super__Vector_impl_data._M_start -
             flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3) *
      -0x5555555555555555 + (long)local_a8 != 1) {
    __assert_fail("values.size() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                  ,0x43,"const Literal &wasm::Flow::getSingleValue()");
  }
  uVar3 = wasm::Literal::getUnsigned();
  if ((uVar3 < 0x10000) || (type.id != 2)) {
    if ((0xffffffff - uVar3 <= x.addr) && (type.id == 2)) {
      wasm::Literal::Literal(&local_f0,(Literal *)&flow.breakTo.super_IString.str._M_str);
      Flow::Flow(__return_storage_ptr__,&local_f0);
      this_00 = &local_f0;
      goto LAB_0012f1f0;
    }
    size.addr = uVar3 + x.addr;
    if (*(ulong *)(lVar2 + 0x40) < size.addr) {
      wasm::Literal::Literal(&local_d8,(Literal *)&flow.breakTo.super_IString.str._M_str);
      Flow::Flow(__return_storage_ptr__,&local_d8);
      this_00 = &local_d8;
      goto LAB_0012f1f0;
    }
    cVar1 = (**(code **)(**(long **)(fail.type.id + 0x288) + 0x30))
                      (*(long **)(fail.type.id + 0x288),info.instance,
                       info.name.super_IString.str._M_len,x.addr << 0x10,size.addr * 0x10000);
    if (cVar1 == '\0') {
      wasm::Literal::Literal(&local_c0,(Literal *)&flow.breakTo.super_IString.str._M_str);
      Flow::Flow(__return_storage_ptr__,&local_c0);
      this_00 = &local_c0;
      goto LAB_0012f1f0;
    }
    memory_00.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
    memory_00.super_IString.str._M_len = (size_t)info.instance;
    setMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)fail.type.id,memory_00,size);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_168;
    wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,(Literal *)&ret);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)ret.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         ret.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         ret.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    ret.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    ret.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ret.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)ret.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)ret.breakTo.super_IString.str._M_len;
  }
  else {
    wasm::Literal::Literal(&local_108,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_108);
    this_00 = &local_108;
LAB_0012f1f0:
    wasm::Literal::~Literal(this_00);
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &ret.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  wasm::Literal::~Literal((Literal *)&ret);
  wasm::Literal::~Literal((Literal *)&flow.breakTo.super_IString.str._M_str);
LAB_0012f216:
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  wasm::Literal::~Literal((Literal *)&flow);
  return __return_storage_ptr__;
}

Assistant:

Flow visitMemoryGrow(MemoryGrow* curr) {
    NOTE_ENTER("MemoryGrow");
    Flow flow = self()->visit(curr->delta);
    if (flow.breaking()) {
      return flow;
    }
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    auto* memory = info.instance->wasm.getMemory(info.name);
    auto indexType = memory->indexType;
    auto fail = Literal::makeFromInt64(-1, memory->indexType);
    Flow ret = Literal::makeFromInt64(memorySize, indexType);
    uint64_t delta = flow.getSingleValue().getUnsigned();
    if (delta > uint32_t(-1) / Memory::kPageSize && indexType == Type::i32) {
      return fail;
    }
    if (memorySize >= uint32_t(-1) - delta && indexType == Type::i32) {
      return fail;
    }
    auto newSize = memorySize + delta;
    if (newSize > memory->max) {
      return fail;
    }
    if (!info.instance->externalInterface->growMemory(
          info.name,
          memorySize * Memory::kPageSize,
          newSize * Memory::kPageSize)) {
      // We failed to grow the memory in practice, even though it was valid
      // to try to do so.
      return fail;
    }
    memorySize = newSize;
    info.instance->setMemorySize(info.name, memorySize);
    return ret;
  }